

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

void fsg_model_writefile(fsg_model_t *fsg,char *file)

{
  FILE *__stream;
  FILE *fp;
  char *file_local;
  fsg_model_t *fsg_local;
  
  if (fsg != (fsg_model_t *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x33d,"Writing FSG file \'%s\'\n",file);
    __stream = fopen(file,"w");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                     ,0x340,"Failed to open FSG file \'%s\' for reading",file);
    }
    else {
      fsg_model_write(fsg,(FILE *)__stream);
      fclose(__stream);
    }
    return;
  }
  __assert_fail("fsg",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x33b,"void fsg_model_writefile(fsg_model_t *, const char *)");
}

Assistant:

void
fsg_model_writefile(fsg_model_t * fsg, char const *file)
{
    FILE *fp;

    assert(fsg);

    E_INFO("Writing FSG file '%s'\n", file);

    if ((fp = fopen(file, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open FSG file '%s' for reading", file);
        return;
    }

    fsg_model_write(fsg, fp);

    fclose(fp);
}